

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

uint32_t bloaty::wasm::GetNumFunctionImports(Section *section)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Arg *in_R8;
  bool bVar5;
  string_view format;
  string_view data;
  string local_70;
  Arg local_50;
  
  if (section->id == 2) {
    data._M_len = (section->contents)._M_len;
    data._M_str = (section->contents)._M_str;
    uVar2 = ReadVarUInt32(&data);
    uVar4 = 0;
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      uVar3 = ReadVarUInt32(&data);
      ReadPiece((ulong)uVar3,&data);
      uVar3 = ReadVarUInt32(&data);
      ReadPiece((ulong)uVar3,&data);
      bVar1 = ReadFixed<unsigned_char,1ul>(&data);
      switch(bVar1) {
      case 0:
        uVar4 = uVar4 + 1;
        ReadVarUInt32(&data);
        break;
      case 1:
        ReadTableType(&data);
        break;
      case 2:
        ReadResizableLimits(&data);
        break;
      case 3:
        ReadGlobalType(&data);
        break;
      default:
        absl::substitute_internal::Arg::Arg(&local_50,(uint)bVar1);
        format._M_str = (char *)&local_50;
        format._M_len = (size_t)"Unrecognized import kind: $0";
        absl::Substitute_abi_cxx11_(&local_70,(absl *)0x1c,format,in_R8);
        Throw(local_70._M_dataplus._M_p,299);
      }
    }
    return uVar4;
  }
  __assert_fail("section.id == Section::kImport",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/webassembly.cc"
                ,0x10f,"uint32_t bloaty::wasm::GetNumFunctionImports(const Section &)");
}

Assistant:

uint32_t GetNumFunctionImports(const Section& section) {
  assert(section.id == Section::kImport);
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);
  uint32_t func_count = 0;

  for (uint32_t i = 0; i < count; i++) {
    uint32_t module_len = ReadVarUInt32(&data);
    ReadPiece(module_len, &data);
    uint32_t field_len = ReadVarUInt32(&data);
    ReadPiece(field_len, &data);
    auto kind = ReadFixed<uint8_t>(&data);

    switch (kind) {
      case ExternalKind::kFunction:
        func_count++;
        ReadVarUInt32(&data);
        break;
      case ExternalKind::kTable:
        ReadTableType(&data);
        break;
      case ExternalKind::kMemory:
        ReadMemoryType(&data);
        break;
      case ExternalKind::kGlobal:
        ReadGlobalType(&data);
        break;
      default:
        THROWF("Unrecognized import kind: $0", kind);
    }
  }

  return func_count;
}